

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O1

void __thiscall
KeyData_DerivePubkeyFromPrivkey_Test::~KeyData_DerivePubkeyFromPrivkey_Test
          (KeyData_DerivePubkeyFromPrivkey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(KeyData, DerivePubkeyFromPrivkey) {
  std::string key1 = "[3456789a/1h/2/3h]xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV";
  std::string path = "0h/1";
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003, 0x80000000, 1};
  std::vector<uint32_t> array2{0x80000000, 1};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'/0'/1", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "xpub6HVH6tVQrwpcGd8TxxyDtsJ8KutNrSBtrL22YprNDJQnkVgTTkNWDLx39bC6VALjHR73fZR8tuETUUNJqW9gbAoDjDoSTdVZp5kVKjG2pmx",
        obj.GetExtPubkey().ToString().c_str());
    EXPECT_STREQ(
        "02a6f2b5dc540788a972bf7e2e5f6275e3b78375cc8739ebc0bc509f06bb0a38c4",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3'/0'/1]02a6f2b5dc540788a972bf7e2e5f6275e3b78375cc8739ebc0bc509f06bb0a38c4",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003/0x80000000/0x1",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h/0h/1]xpub6HVH6tVQrwpcGd8TxxyDtsJ8KutNrSBtrL22YprNDJQnkVgTTkNWDLx39bC6VALjHR73fZR8tuETUUNJqW9gbAoDjDoSTdVZp5kVKjG2pmx",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    obj1 = obj1.DerivePubkey(path, false);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }

  auto check_func2 = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("0'/1", obj.GetBip32Path().c_str());
    EXPECT_STREQ("ae05dbb7", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "xpub6HVH6tVQrwpcGd8TxxyDtsJ8KutNrSBtrL22YprNDJQnkVgTTkNWDLx39bC6VALjHR73fZR8tuETUUNJqW9gbAoDjDoSTdVZp5kVKjG2pmx",
        obj.GetExtPubkey().ToString().c_str());
    EXPECT_STREQ(
        "02a6f2b5dc540788a972bf7e2e5f6275e3b78375cc8739ebc0bc509f06bb0a38c4",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[ae05dbb7/0'/1]02a6f2b5dc540788a972bf7e2e5f6275e3b78375cc8739ebc0bc509f06bb0a38c4",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000000/0x1",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[ae05dbb7/0h/1]xpub6HVH6tVQrwpcGd8TxxyDtsJ8KutNrSBtrL22YprNDJQnkVgTTkNWDLx39bC6VALjHR73fZR8tuETUUNJqW9gbAoDjDoSTdVZp5kVKjG2pmx",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj2;
  try {
    obj2 = KeyData(key1);
    obj2 = obj2.DerivePubkey(path, true);
    check_func2(obj2, array2);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }
}